

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_false,_pugi::impl::(anonymous_namespace)::opt_true>
         ::parse(char_t *s)

{
  size_t sVar1;
  byte *pbVar2;
  byte bVar3;
  byte *s_00;
  gap g;
  gap local_28;
  
  local_28.end = (char_t *)0x0;
  local_28.size = 0;
  do {
    do {
      s_00 = (byte *)s;
      sVar1 = local_28.size;
      bVar3 = *s_00;
      if (((anonymous_namespace)::chartype_table[bVar3] & 1) != 0) goto LAB_0032ea16;
      bVar3 = s_00[1];
      if (((anonymous_namespace)::chartype_table[bVar3] & 1) != 0) {
        s_00 = s_00 + 1;
        goto LAB_0032ea16;
      }
      bVar3 = s_00[2];
      if (((anonymous_namespace)::chartype_table[bVar3] & 1) != 0) {
        s_00 = s_00 + 2;
        goto LAB_0032ea16;
      }
      bVar3 = s_00[3];
      s = (char_t *)(s_00 + 4);
    } while (((anonymous_namespace)::chartype_table[bVar3] & 1) == 0);
    s_00 = s_00 + 3;
LAB_0032ea16:
    if (bVar3 == 0x26) {
      s = strconv_escape((char_t *)s_00,&local_28);
    }
    else {
      if (bVar3 == 0) {
        pbVar2 = s_00;
        if (local_28.end != (char_t *)0x0) {
          memmove(local_28.end + -local_28.size,local_28.end,(long)s_00 - (long)local_28.end);
          pbVar2 = s_00 + -sVar1;
        }
        *pbVar2 = 0;
        return (char_t *)s_00;
      }
      if (bVar3 == 0x3c) {
        pbVar2 = s_00;
        if (local_28.end != (char_t *)0x0) {
          memmove(local_28.end + -local_28.size,local_28.end,(long)s_00 - (long)local_28.end);
          pbVar2 = s_00 + -sVar1;
        }
        *pbVar2 = 0;
        return (char_t *)(s_00 + 1);
      }
      s = (char_t *)(s_00 + 1);
    }
  } while( true );
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}